

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_script_from_miniscript
              (miniscript_node_t *node,miniscript_node_t *parent,uint32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  uint uVar1;
  char *path;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t *astarisk_index_00;
  bool bVar6;
  size_t sStackY_650;
  int8_t astarisk_index;
  size_t output_len;
  uint32_t count;
  size_t *local_620;
  uchar pubkey [33];
  uint32_t local_5a0;
  uchar uStack_599;
  uchar local_598 [7];
  uchar uStack_591;
  uchar auStack_590 [7];
  uchar uStack_589;
  uchar local_588 [7];
  uchar uStack_581;
  uchar auStack_580 [7];
  uchar uStack_579;
  uchar bip32_serialized [82];
  ext_key derive_extkey;
  uchar privkey [38];
  
  output_len = 0;
  if (node->info == (miniscript_item_t *)0x0) {
    uVar1 = node->kind;
    if (uVar1 == 0x1020 || (uVar1 & 4) != 0) {
      iVar3 = wally_hex_to_bytes(node->data,script,script_len,write_len);
      if (iVar3 != 0) {
        return iVar3;
      }
      if (node->kind != 0x1020) {
        return 0;
      }
      if (*write_len == 0x20) {
        node->is_xonly_key = true;
        return 0;
      }
      if (*write_len != 0x41) {
        return 0;
      }
      node->is_uncompress_key = true;
      return 0;
    }
    if (uVar1 == 0x2020) {
      if ((0x40 < script_len) &&
         ((iVar3 = wally_base58_to_bytes(node->data,1,privkey,0x26,&output_len), iVar3 != 0 ||
          (0x20 < output_len)))) {
        iVar3 = wally_ec_public_key_from_private_key(privkey + 1,0x20,pubkey,0x21);
        if (iVar3 != 0) {
          return iVar3;
        }
        if ((node->network_type & 0xfffffffd) == 0) {
          node->network_type = 2;
          if ((output_len == 0x22) && (privkey[0x21] == '\x01')) {
            if (node->is_xonly_key == true) {
              *(ulong *)(script + 0x10) = CONCAT17(pubkey[0x18],pubkey._17_7_);
              *(ulong *)(script + 0x18) = CONCAT17(pubkey[0x20],pubkey._25_7_);
              *(ulong *)script = CONCAT17(pubkey[8],pubkey._1_7_);
              *(ulong *)(script + 8) = CONCAT17(pubkey[0x10],pubkey._9_7_);
              *write_len = 0x20;
            }
            else {
              script[0x20] = pubkey[0x20];
              *(ulong *)(script + 0x10) = CONCAT71(pubkey._17_7_,pubkey[0x10]);
              *(ulong *)(script + 0x18) = CONCAT71(pubkey._25_7_,pubkey[0x18]);
              *(ulong *)script = CONCAT71(pubkey._1_7_,pubkey[0]);
              *(ulong *)(script + 8) = CONCAT71(pubkey._9_7_,pubkey[8]);
              *write_len = 0x21;
            }
          }
          else {
            iVar3 = wally_ec_public_key_decompress(pubkey,0x21,script,0x41);
            if (iVar3 != 0) {
              return iVar3;
            }
            *write_len = 0x41;
            node->is_uncompress_key = true;
          }
          goto LAB_00167ded;
        }
      }
    }
    else {
      if ((uVar1 == 0x110) || (uVar1 == 0x210)) {
        iVar3 = analyze_miniscript_addr
                          (node->data,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,
                           (address_script_t *)0x0,script,script_len,write_len);
        return iVar3;
      }
      if (uVar1 == 8) {
        iVar3 = generate_script_from_number(node->number,parent,script,script_len,write_len);
        return iVar3;
      }
      if ((~uVar1 & 0x4020) == 0) {
        astarisk_index = -1;
        count = 0;
        astarisk_index_00 = write_len;
        wally_bzero(pubkey,0xc0);
        wally_bzero(&derive_extkey,0xc0);
        iVar3 = wally_base58_to_bytes(node->data,1,bip32_serialized,0x52,&output_len);
        if (iVar3 != 0) {
          return iVar3;
        }
        if (0x52 < output_len) {
          return -2;
        }
        iVar3 = bip32_key_unserialize(bip32_serialized,output_len,(ext_key *)pubkey);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = node->kind;
        if ((local_5a0 == 0x488ade4 && iVar3 == 0x14020) ||
           (local_5a0 == 0x488b21e && iVar3 != 0x14020)) {
          if (1 < node->network_type) {
            return -2;
          }
          node->network_type = 1;
        }
        else {
          if ((node->network_type & 0xfffffffd) != 0) {
            return -2;
          }
          node->network_type = 2;
        }
        path = node->derive_path;
        if ((path != (char *)0x0) && (*path != '\0')) {
          iVar3 = convert_bip32_path_to_array
                            (path,(uint32_t *)privkey,(uint)(iVar3 == 0x14020),SUB81(&count,0),
                             (uint32_t *)&astarisk_index,(int8_t *)astarisk_index_00);
          if (iVar3 != 0) {
            return iVar3;
          }
          if (-1 < (long)astarisk_index) {
            *(uint *)(privkey + (long)astarisk_index * 4) =
                 *(uint *)(privkey + (long)astarisk_index * 4) | derive_child_num;
          }
          iVar3 = bip32_key_from_parent_path
                            ((ext_key *)pubkey,(uint32_t *)privkey,(ulong)count,1,&derive_extkey);
          if (iVar3 != 0) {
            return iVar3;
          }
          memcpy(pubkey,&derive_extkey,0xc0);
        }
        if (node->is_xonly_key == true) {
          *(ulong *)(script + 0x10) = CONCAT17(uStack_581,local_588);
          *(ulong *)(script + 0x18) = CONCAT17(uStack_579,auStack_580);
          *(ulong *)script = CONCAT17(uStack_591,local_598);
          *(ulong *)(script + 8) = CONCAT17(uStack_589,auStack_590);
          sStackY_650 = 0x20;
        }
        else {
          script[0x20] = uStack_579;
          *(ulong *)(script + 0x10) = CONCAT71(local_588,uStack_589);
          *(ulong *)(script + 0x18) = CONCAT71(auStack_580,uStack_581);
          *(ulong *)script = CONCAT71(local_598,uStack_599);
          *(ulong *)(script + 8) = CONCAT71(auStack_590,uStack_591);
          sStackY_650 = 0x21;
        }
        *write_len = sStackY_650;
        goto LAB_00167ded;
      }
    }
    iVar3 = -2;
  }
  else {
    output_len = *write_len;
    iVar3 = (*node->info->generate_function)
                      (node,parent,derive_child_num,script,script_len,&output_len);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_620 = write_len;
    if (node->wrapper != 0) {
      sVar4 = strlen(node->wrapper_str);
      while (bVar6 = sVar4 != 0, sVar4 = sVar4 - 1, bVar6) {
        lVar2 = 0;
        do {
          lVar5 = lVar2;
          if (lVar5 + 0x28 == 0x1b8) {
            return -2;
          }
          lVar2 = lVar5 + 0x28;
        } while (**(char **)((long)&miniscript_wrapper_table[0].name + lVar5) !=
                 node->wrapper_str[sVar4]);
        iVar3 = (**(code **)((long)&miniscript_wrapper_table[0].generate_function + lVar5))
                          (script,script_len,&output_len);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
    }
    *local_620 = output_len;
LAB_00167ded:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int generate_script_from_miniscript(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    uint32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t output_len = 0;
    size_t len;
    size_t index;
    size_t table_idx;
    size_t max;
    const struct miniscript_wrapper_item_t *item = NULL;

    if (node->info) {
        output_len = *write_len;
        ret = node->info->generate_function(node, parent, derive_child_num, script,
                                            script_len, &output_len);
        if (ret != WALLY_OK)
            return ret;

        if (node->wrapper != 0) {
            /* back from wrapper string */
            max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
            len = strlen(node->wrapper_str);
            for (index = len; index > 0; --index) {
                item = NULL;
                for (table_idx = 0; table_idx < max; ++table_idx) {
                    if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                        item = &miniscript_wrapper_table[table_idx];
                        break;
                    }
                }
                if (!item) {
                    return WALLY_EINVAL;
                }

                ret = item->generate_function(script, script_len, &output_len);
                if (ret != WALLY_OK)
                    return ret;
            }
        }
        *write_len = output_len;
        return ret;
    }

    /* value data */
    if ((node->kind & DESCRIPTOR_KIND_RAW) || (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
        ret = wally_hex_to_bytes(node->data, script, script_len, write_len);
        if (((ret == WALLY_OK)) && (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
            if (*write_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
                node->is_uncompress_key = true;
            else if (*write_len == XONLY_PUBLIC_KEY_LEN)
                node->is_xonly_key = true;
        }
    } else if (node->kind == DESCRIPTOR_KIND_NUMBER) {
        ret = generate_script_from_number(node->number, parent, script, script_len, write_len);
    } else if ((node->kind == DESCRIPTOR_KIND_BASE58) || (node->kind == DESCRIPTOR_KIND_BECH32)) {
        ret = analyze_miniscript_addr(node->data, NULL, NULL, NULL, script, script_len, write_len);
    } else if (node->kind == DESCRIPTOR_KIND_PRIVATE_KEY) {
        unsigned char privkey[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
        unsigned char pubkey[EC_PUBLIC_KEY_LEN];
        if (script_len < EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
            return WALLY_EINVAL;

        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM, privkey,
                                    sizeof(privkey), &output_len);
        if ((ret == WALLY_OK) && (output_len < EC_PRIVATE_KEY_LEN + 1))
            return WALLY_EINVAL;

        ret = wally_ec_public_key_from_private_key(&privkey[1], EC_PRIVATE_KEY_LEN,
                                                   pubkey, sizeof(pubkey));
        if (ret == WALLY_OK) {
            if (privkey[0] == WALLY_ADDRESS_VERSION_WIF_MAINNET) {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_MAINNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
            } else {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_TESTNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
            }
        }
        if (ret == WALLY_OK) {
            if ((output_len == EC_PRIVATE_KEY_LEN + 2) && (privkey[EC_PRIVATE_KEY_LEN + 1] == 1)) {
                if (node->is_xonly_key) {
                    memcpy(script, &pubkey[1], XONLY_PUBLIC_KEY_LEN);
                    *write_len = XONLY_PUBLIC_KEY_LEN;
                } else {
                    memcpy(script, pubkey, EC_PUBLIC_KEY_LEN);
                    *write_len = EC_PUBLIC_KEY_LEN;
                }
            } else {
                ret = wally_ec_public_key_decompress(pubkey, sizeof(pubkey), script,
                                                     EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
                if (ret == WALLY_OK) {
                    *write_len = EC_PUBLIC_KEY_UNCOMPRESSED_LEN;
                    node->is_uncompress_key = true;
                }
            }
        }
    } else if ((node->kind & DESCRIPTOR_KIND_BIP32) == DESCRIPTOR_KIND_BIP32) {
        unsigned char bip32_serialized[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
        struct ext_key extkey;
        struct ext_key derive_extkey;
        uint32_t bip32_array[DESCRIPTOR_BIP32_PATH_NUM_MAX];
        int8_t astarisk_index = -1;
        uint32_t count = 0;

        wally_bzero(&extkey, sizeof(struct ext_key));
        wally_bzero(&derive_extkey, sizeof(struct ext_key));
        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM,
                                    bip32_serialized, sizeof(bip32_serialized), &output_len);
        if (ret != WALLY_OK)
            return ret;
        if (output_len > sizeof(bip32_serialized))
            return WALLY_EINVAL;

        ret = bip32_key_unserialize(bip32_serialized, output_len, &extkey);
        if (ret != WALLY_OK)
            return ret;

        if (((node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PRIVATE)) ||
            ((node->kind != DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PUBLIC))) {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_MAINNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
        } else {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_TESTNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
        }

        if (node->derive_path && node->derive_path[0] != '\0') {
            ret = convert_bip32_path_to_array(node->derive_path, bip32_array,
                                              DESCRIPTOR_BIP32_PATH_NUM_MAX,
                                              (node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY),
                                              &count, &astarisk_index);
            if (ret != WALLY_OK)
                return ret;

            if (astarisk_index >= 0)
                bip32_array[astarisk_index] |= derive_child_num;

            ret = bip32_key_from_parent_path(&extkey, bip32_array, count,
                                             BIP32_FLAG_KEY_PUBLIC, &derive_extkey);
            if (ret != WALLY_OK)
                return ret;

            memcpy(&extkey, &derive_extkey, sizeof(extkey));
        }
        if (node->is_xonly_key) {
            memcpy(script, &extkey.pub_key[1], XONLY_PUBLIC_KEY_LEN);
            *write_len = XONLY_PUBLIC_KEY_LEN;
        } else {
            memcpy(script, extkey.pub_key, EC_PUBLIC_KEY_LEN);
            *write_len = EC_PUBLIC_KEY_LEN;
        }
    } else {
        return WALLY_EINVAL;
    }

    return ret;
}